

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cc
# Opt level: O3

bool __thiscall
FIX::double_conversion::DoubleToStringConverter::ToPrecision
          (DoubleToStringConverter *this,double value,int precision,StringBuilder *result_builder)

{
  bool bVar1;
  int digits_after_point;
  bool sign;
  int decimal_point;
  int decimal_rep_length;
  char decimal_rep [121];
  bool local_bd;
  int local_bc;
  double local_b8;
  uint local_ac;
  char local_a8 [128];
  
  if (0x7fefffffffffffff < (ulong)ABS(value)) {
    bVar1 = HandleSpecialValues(this,value,result_builder);
    return bVar1;
  }
  if (precision - 0x79U < 0xffffff88) {
    bVar1 = false;
  }
  else {
    local_b8 = value;
    DoubleToAscii(value,PRECISION,precision,local_a8,0x79,&local_bd,(int *)&local_ac,&local_bc);
    if (precision < (int)local_ac) {
      __assert_fail("decimal_rep_length <= precision",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                    ,0x132,
                    "bool FIX::double_conversion::DoubleToStringConverter::ToPrecision(double, int, StringBuilder *) const"
                   );
    }
    if ((local_bd == true) && (local_b8 != 0.0 || (this->flags_ & 8U) == 0)) {
      StringBuilder::AddCharacter(result_builder,'-');
    }
    if ((this->max_leading_padding_zeroes_in_precision_mode_ < 1 - local_bc) ||
       (this->max_trailing_padding_zeroes_in_precision_mode_ <
        (int)((local_bc - precision) + (uint)(((uint)this->flags_ >> 2 & 1) != 0)))) {
      if ((int)local_ac < precision) {
        memset(local_a8 + (int)local_ac,0x30,(ulong)(~local_ac + precision) + 1);
      }
      CreateExponentialRepresentation(this,local_a8,precision,local_bc + -1,result_builder);
    }
    else {
      digits_after_point = 0;
      if (0 < precision - local_bc) {
        digits_after_point = precision - local_bc;
      }
      CreateDecimalRepresentation(this,local_a8,local_ac,local_bc,digits_after_point,result_builder)
      ;
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool DoubleToStringConverter::ToPrecision(double value,
                                          int precision,
                                          StringBuilder* result_builder) const {
  if (Double(value).IsSpecial()) {
    return HandleSpecialValues(value, result_builder);
  }

  if (precision < kMinPrecisionDigits || precision > kMaxPrecisionDigits) {
    return false;
  }

  // Find a sufficiently precise decimal representation of n.
  int decimal_point;
  bool sign;
  // Add one for the terminating null character.
  const int kDecimalRepCapacity = kMaxPrecisionDigits + 1;
  char decimal_rep[kDecimalRepCapacity];
  int decimal_rep_length;

  DoubleToAscii(value, PRECISION, precision,
                decimal_rep, kDecimalRepCapacity,
                &sign, &decimal_rep_length, &decimal_point);
  ASSERT(decimal_rep_length <= precision);

  bool unique_zero = ((flags_ & UNIQUE_ZERO) != 0);
  if (sign && (value != 0.0 || !unique_zero)) {
    result_builder->AddCharacter('-');
  }

  // The exponent if we print the number as x.xxeyyy. That is with the
  // decimal point after the first digit.
  int exponent = decimal_point - 1;

  int extra_zero = ((flags_ & EMIT_TRAILING_ZERO_AFTER_POINT) != 0) ? 1 : 0;
  if ((-decimal_point + 1 > max_leading_padding_zeroes_in_precision_mode_) ||
      (decimal_point - precision + extra_zero >
       max_trailing_padding_zeroes_in_precision_mode_)) {
    // Fill buffer to contain 'precision' digits.
    // Usually the buffer is already at the correct length, but 'DoubleToAscii'
    // is allowed to return less characters.
    for (int i = decimal_rep_length; i < precision; ++i) {
      decimal_rep[i] = '0';
    }

    CreateExponentialRepresentation(decimal_rep,
                                    precision,
                                    exponent,
                                    result_builder);
  } else {
    CreateDecimalRepresentation(decimal_rep, decimal_rep_length, decimal_point,
                                Max(0, precision - decimal_point),
                                result_builder);
  }
  return true;
}